

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 ExtractToken(char **pzIn,char *zEnd,char *zMask,int nMasklen,SyString *pOut)

{
  byte *pbVar1;
  int i;
  ulong uVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)*pzIn;
  if (pbVar3 < zEnd) {
    do {
      pbVar1 = pbVar3;
      if ((nMasklen < 1) || (0xbf < *pbVar3)) {
joined_r0x00136cf1:
        do {
          if (zEnd <= pbVar1) {
LAB_00136d38:
            pOut->zString = (char *)pbVar3;
            pOut->nByte = (int)pbVar1 - (int)pbVar3;
            *pzIn = (char *)pbVar1;
            return 0;
          }
          if ((*pbVar1 < 0xc0) && (0 < nMasklen)) {
            uVar2 = 0;
            do {
              if (zMask[uVar2] == *pbVar1) goto LAB_00136d38;
              uVar2 = uVar2 + 1;
            } while ((uint)nMasklen != uVar2);
          }
          pbVar1 = pbVar1 + 1;
        } while( true );
      }
      uVar2 = 0;
      while (zMask[uVar2] != *pbVar3) {
        uVar2 = uVar2 + 1;
        if ((uint)nMasklen == uVar2) goto joined_r0x00136cf1;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)zEnd);
  }
  return -0x12;
}

Assistant:

static sxi32 ExtractToken(const char **pzIn, const char *zEnd, const char *zMask, int nMasklen, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading delimiter */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && CheckMask(zIn[0], zMask, nMasklen, 0) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd ){
		if( (unsigned char)zIn[0] >= 0xc0 ){
			/* UTF-8 stream */
			zIn++;
			SX_JMP_UTF8(zIn, zEnd);
		}else{
			if( CheckMask(zIn[0], zMask, nMasklen, 0) ){
				break;
			}
			zIn++;
		}
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Update the cursor */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}